

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::UnitTestImpl::CurrentOsStackTraceExceptTop_abi_cxx11_
          (string *__return_storage_ptr__,UnitTestImpl *this,int skip_count)

{
  OsStackTraceGetterInterface *pOVar1;
  undefined **ppuVar2;
  
  pOVar1 = this->os_stack_trace_getter_;
  if (pOVar1 == (OsStackTraceGetterInterface *)0x0) {
    pOVar1 = (OsStackTraceGetterInterface *)operator_new(8);
    ppuVar2 = &PTR__OsStackTraceGetterInterface_0014a108;
    pOVar1->_vptr_OsStackTraceGetterInterface =
         (_func_int **)&PTR__OsStackTraceGetterInterface_0014a108;
    this->os_stack_trace_getter_ = pOVar1;
  }
  else {
    ppuVar2 = pOVar1->_vptr_OsStackTraceGetterInterface;
  }
  (*((_func_int **)ppuVar2)[2])
            (__return_storage_ptr__,pOVar1,(ulong)FLAGS_gtest_stack_trace_depth,
             (ulong)(skip_count + 1));
  return __return_storage_ptr__;
}

Assistant:

std::string UnitTestImpl::CurrentOsStackTraceExceptTop(int skip_count) {
  return os_stack_trace_getter()->CurrentStackTrace(
      static_cast<int>(GTEST_FLAG(stack_trace_depth)),
      skip_count + 1
      // Skips the user-specified number of frames plus this function
      // itself.
      );  // NOLINT
}